

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_function_primitive_apply
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t argument;
  ulong local_138;
  size_t i_1;
  sysbvm_tuple_t argumentArray;
  size_t i;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  size_t callArgumentCount;
  size_t argumentListSize;
  size_t variadicArgumentCount;
  sysbvm_tuple_t *argumentList;
  sysbvm_tuple_t *function;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  sVar2 = sysbvm_array_getSize(*psVar1);
  callArgumentCount = 0;
  callFrameStack.gcRoots.applicationArguments[0xf] = 0;
  if (sVar2 != 0) {
    sVar3 = sysbvm_array_at(*psVar1,sVar2 - 1);
    callArgumentCount = sysbvm_array_getSize(sVar3);
    callFrameStack.gcRoots.applicationArguments[0xf] = (sVar2 - 1) + callArgumentCount;
  }
  memset(&callFrameStackRecord.roots,0,0xb0);
  memset(&i,0,0x20);
  callFrameStackRecord.previous._0_4_ = 0;
  callFrameStackRecord.type = 0x11;
  callFrameStackRecord._12_4_ = 0;
  callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&i);
  sysbvm_functionCallFrameStack_begin
            (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,*arguments,
             callFrameStack.gcRoots.applicationArguments[0xf],0);
  if (sVar2 != 0) {
    for (argumentArray = 0; argumentArray < sVar2 - 1; argumentArray = argumentArray + 1) {
      sVar3 = sysbvm_array_at(*psVar1,argumentArray);
      sysbvm_functionCallFrameStack_push
                ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,sVar3);
    }
    sVar3 = sysbvm_array_at(*psVar1,sVar2 - 1);
    for (local_138 = 0; local_138 < callArgumentCount; local_138 = local_138 + 1) {
      argument = sysbvm_array_at(sVar3,local_138);
      sysbvm_functionCallFrameStack_push
                ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,argument);
    }
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&i);
  sVar3 = sysbvm_functionCallFrameStack_finish
                    (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_apply(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *argumentList = &arguments[1];

    size_t variadicArgumentCount = sysbvm_array_getSize(*argumentList);
    size_t argumentListSize = 0;
    size_t callArgumentCount = 0;
    if(variadicArgumentCount > 0)
    {
        argumentListSize = sysbvm_array_getSize(sysbvm_array_at(*argumentList, variadicArgumentCount - 1));
        callArgumentCount = variadicArgumentCount - 1 + argumentListSize;
    }

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, *function, callArgumentCount, 0);
    if(variadicArgumentCount > 0)
    {
        for(size_t i = 0; i < variadicArgumentCount - 1; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(*argumentList, i));
        
        sysbvm_tuple_t argumentArray = sysbvm_array_at(*argumentList, variadicArgumentCount - 1);
        for(size_t i = 0; i < argumentListSize; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(argumentArray, i));
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}